

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::NSSnapValues::EmitTopLevelCommonBodyResolveInfo
               (TopLevelCommonBodyResolveInfo *fbInfo,bool emitInline,ThreadContext *threadContext,
               FileWriter *writer,Separator separator)

{
  bool bVar1;
  Separator separator_local;
  FileWriter *writer_local;
  ThreadContext *threadContext_local;
  bool emitInline_local;
  TopLevelCommonBodyResolveInfo *fbInfo_local;
  
  (*writer->_vptr_FileWriter[6])(writer,(ulong)separator);
  FileWriter::WriteUInt32(writer,functionBodyId,fbInfo->TopLevelBodyCtr,NoSeparator);
  FileWriter::WriteLogTag(writer,ctxTag,fbInfo->ScriptContextLogId,CommaSeparator);
  FileWriter::WriteString(writer,name,&fbInfo->FunctionName,CommaSeparator);
  FileWriter::WriteUInt64(writer,moduleId,(ulong)fbInfo->ModuleId,CommaSeparator);
  FileWriter::WriteUInt64(writer,sourceContextId,fbInfo->SourceContextId,CommaSeparator);
  FileWriter::WriteString(writer,uri,&fbInfo->SourceUri,CommaSeparator);
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)(fbInfo->IsUtf8 & 1),1);
  FileWriter::WriteLengthValue(writer,fbInfo->ByteLength,CommaSeparator);
  (*writer->_vptr_FileWriter[3])(writer,0x43,1);
  EmitSnapFunctionBodyScopeChain(&fbInfo->ScopeChainInfo,writer);
  if ((!emitInline) && (bVar1 = IsNullPtrTTString(&fbInfo->SourceUri), !bVar1)) {
    JsSupport::WriteCodeToFile
              (threadContext,false,fbInfo->TopLevelBodyCtr,(bool)(fbInfo->IsUtf8 & 1),
               fbInfo->SourceBuffer,fbInfo->ByteLength);
    return;
  }
  if ((fbInfo->IsUtf8 & 1U) == 0) {
    (*writer->_vptr_FileWriter[0x17])
              (writer,fbInfo->SourceBuffer,(ulong)(fbInfo->ByteLength >> 1),1);
    return;
  }
  TTDAbort_unrecoverable_error("Should only emit char16 encoded data in inline mode.");
}

Assistant:

void EmitTopLevelCommonBodyResolveInfo(const TopLevelCommonBodyResolveInfo* fbInfo, bool emitInline, ThreadContext* threadContext, FileWriter* writer, NSTokens::Separator separator)
        {
            writer->WriteRecordStart(separator);
            writer->WriteUInt32(NSTokens::Key::functionBodyId, fbInfo->TopLevelBodyCtr);
            writer->WriteLogTag(NSTokens::Key::ctxTag, fbInfo->ScriptContextLogId, NSTokens::Separator::CommaSeparator);

            writer->WriteString(NSTokens::Key::name, fbInfo->FunctionName, NSTokens::Separator::CommaSeparator);

            writer->WriteUInt64(NSTokens::Key::moduleId, fbInfo->ModuleId, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt64(NSTokens::Key::sourceContextId, fbInfo->SourceContextId, NSTokens::Separator::CommaSeparator);
            writer->WriteString(NSTokens::Key::uri, fbInfo->SourceUri, NSTokens::Separator::CommaSeparator);

            writer->WriteBool(NSTokens::Key::boolVal, fbInfo->IsUtf8, NSTokens::Separator::CommaSeparator);
            writer->WriteLengthValue(fbInfo->ByteLength, NSTokens::Separator::CommaSeparator);

            writer->WriteKey(NSTokens::Key::scopeChain, NSTokens::Separator::CommaSeparator);
            EmitSnapFunctionBodyScopeChain(fbInfo->ScopeChainInfo, writer);

            if(emitInline || IsNullPtrTTString(fbInfo->SourceUri))
            {
                TTDAssert(!fbInfo->IsUtf8, "Should only emit char16 encoded data in inline mode.");

                writer->WriteInlineCode((char16*)fbInfo->SourceBuffer, fbInfo->ByteLength / sizeof(char16), NSTokens::Separator::CommaSeparator);
            }
            else
            {
                JsSupport::WriteCodeToFile(threadContext, false, fbInfo->TopLevelBodyCtr, fbInfo->IsUtf8, fbInfo->SourceBuffer, fbInfo->ByteLength);
            }
        }